

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O0

HRESULT utf8::NarrowStringToWideNoAlloc
                  (LPCSTR sourceString,size_t sourceCount,LPWSTR destString,size_t destBufferCount,
                  charcount_t *destCount)

{
  char cVar1;
  code *pcVar2;
  bool bVar3;
  charcount_t cVar4;
  uint uVar5;
  undefined4 *puVar6;
  size_t local_78;
  charcount_t cchDestString;
  WCHAR *remDestString;
  LPCUTF8 remSourceString;
  size_t fallback;
  char ch;
  size_t cbSourceString;
  size_t sourceStart;
  charcount_t *destCount_local;
  size_t destBufferCount_local;
  LPWSTR destString_local;
  size_t sourceCount_local;
  LPCSTR sourceString_local;
  
  cbSourceString = 0;
  if (sourceCount < 0xffffffff) {
    if (destString == (LPWSTR)0x0) {
      sourceString_local._4_4_ = -0x7ff8ffa9;
    }
    else if (sourceCount < destBufferCount) {
      for (; cbSourceString < sourceCount; cbSourceString = cbSourceString + 1) {
        cVar1 = sourceString[cbSourceString];
        if ((cVar1 < '\x01') || ('\x7f' < cVar1)) {
          if (cbSourceString < 4) {
            local_78 = cbSourceString;
          }
          else {
            local_78 = 3;
          }
          cbSourceString = cbSourceString - local_78;
          break;
        }
        destString[cbSourceString] = (short)cVar1;
      }
      if (cbSourceString == sourceCount) {
        *destCount = (charcount_t)sourceCount;
        destString[sourceCount] = L'\0';
      }
      else {
        cVar4 = ByteIndexIntoCharacterIndex
                          ((LPCUTF8)(sourceString + cbSourceString),sourceCount - cbSourceString,
                           doDefault);
        uVar5 = (int)cbSourceString + cVar4;
        if (sourceCount < uVar5) {
          return -0x7ff8fff2;
        }
        DecodeUnitsIntoAndNullTerminateNoAdvance
                  (destString + cbSourceString,(LPCUTF8)(sourceString + cbSourceString),
                   (LPCUTF8)(sourceString + sourceCount),doAllowInvalidWCHARs,(bool *)0x0);
        *destCount = uVar5;
      }
      if (destString[*destCount] != L'\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                           ,0xaa,"(destString[*destCount] == 0)","destString[*destCount] == 0");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      sourceString_local._4_4_ = 0;
    }
    else {
      *destString = L'\0';
      sourceString_local._4_4_ = -0x7ff8ffa9;
    }
  }
  else {
    *destString = L'\0';
    sourceString_local._4_4_ = -0x7ff8fff2;
  }
  return sourceString_local._4_4_;
}

Assistant:

inline HRESULT NarrowStringToWideNoAlloc(_In_ LPCSTR sourceString, size_t sourceCount,
        __out_ecount(destBufferCount) LPWSTR destString, size_t destBufferCount, _Out_ charcount_t* destCount)
    {
        size_t sourceStart = 0;
        size_t cbSourceString = sourceCount;

        if (sourceCount >= MAXUINT32)
        {
            destString[0] = WCHAR(0);
            return E_OUTOFMEMORY;
        }

        if (destString == nullptr)
        {
            return E_INVALIDARG;
        }

        if (sourceCount >= destBufferCount)
        {
            destString[0] = WCHAR(0);
            return E_INVALIDARG;
        }

        for (; sourceStart < sourceCount; sourceStart++)
        {
            const char ch = sourceString[sourceStart];
            if ( ! (ch > 0 && ch < 0x0080) )
            {
                size_t fallback = sourceStart > 3 ? 3 : sourceStart; // 3 + 1 -> fallback at least 1 unicode char
                sourceStart -= fallback;
                break;
            }
            destString[sourceStart] = (WCHAR) ch;
        }

        if (sourceStart == sourceCount)
        {
            *destCount = static_cast<charcount_t>(sourceCount);
            destString[sourceCount] = WCHAR(0);
        }
        else
        {
            LPCUTF8 remSourceString = (LPCUTF8)sourceString + sourceStart;
            WCHAR *remDestString = destString + sourceStart;

            charcount_t cchDestString = utf8::ByteIndexIntoCharacterIndex(remSourceString, cbSourceString - sourceStart);
            cchDestString += (charcount_t)sourceStart;
            if (cchDestString > sourceCount)
            {
                return E_OUTOFMEMORY;
            }

            // Some node tests depend on the utf8 decoder not swallowing invalid unicode characters
            // instead of replacing them with the "replacement" chracter. Pass a flag to our
            // decoder to require such behavior
            utf8::DecodeUnitsIntoAndNullTerminateNoAdvance(remDestString, remSourceString, (LPCUTF8) sourceString + cbSourceString, DecodeOptions::doAllowInvalidWCHARs);

            static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
            *destCount = cchDestString;
        }

        Assert(destString[*destCount] == 0);

        return S_OK;
    }